

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O1

void __thiscall CommandLineParser::CommandLineParser(CommandLineParser *this,int argc,char **argv)

{
  ulong uVar1;
  string argument;
  allocator<char> local_81;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  PlugIns *local_58;
  value_type local_50;
  
  this->_vptr_CommandLineParser = (_func_int **)&PTR__CommandLineParser_0010ad18;
  this->m_useCompiler = false;
  this->m_useXml = false;
  local_60 = &(this->m_xmlFileName).field_2;
  (this->m_xmlFileName)._M_dataplus._M_p = (pointer)local_60;
  (this->m_xmlFileName)._M_string_length = 0;
  (this->m_xmlFileName).field_2._M_local_buf[0] = '\0';
  local_68 = &(this->m_xsl).field_2;
  (this->m_xsl)._M_dataplus._M_p = (pointer)local_68;
  (this->m_xsl)._M_string_length = 0;
  (this->m_xsl).field_2._M_local_buf[0] = '\0';
  local_70 = &(this->m_encoding).field_2;
  (this->m_encoding)._M_dataplus._M_p = (pointer)local_70;
  (this->m_encoding)._M_string_length = 0;
  (this->m_encoding).field_2._M_local_buf[0] = '\0';
  local_78 = &(this->m_testPath).field_2;
  this->m_waitBeforeExit = false;
  this->m_briefProgress = false;
  this->m_noProgress = false;
  this->m_useText = false;
  this->m_useCout = false;
  (this->m_testPath)._M_dataplus._M_p = (pointer)local_78;
  (this->m_testPath)._M_string_length = 0;
  (this->m_testPath).field_2._M_local_buf[0] = '\0';
  (this->m_plugIns).super__Deque_base<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_plugIns).super__Deque_base<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->m_plugIns).super__Deque_base<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_plugIns).super__Deque_base<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_plugIns).super__Deque_base<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_plugIns).super__Deque_base<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_plugIns).super__Deque_base<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_plugIns).super__Deque_base<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_plugIns).super__Deque_base<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_plugIns).super__Deque_base<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>::_M_initialize_map
            (&(this->m_plugIns).
              super__Deque_base<CommandLinePlugInInfo,_std::allocator<CommandLinePlugInInfo>_>,0);
  (this->m_arguments).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_arguments).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->m_arguments).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_arguments).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_arguments).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_arguments).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_arguments).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_arguments).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_arguments).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_arguments).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_58 = &this->m_plugIns;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&(this->m_arguments).
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,0);
  this->m_currentArgument = 0;
  local_80 = &(this->m_option).field_2;
  (this->m_option)._M_dataplus._M_p = (pointer)local_80;
  (this->m_option)._M_string_length = 0;
  (this->m_option).field_2._M_local_buf[0] = '\0';
  if (1 < argc) {
    uVar1 = 1;
    do {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,argv[uVar1],&local_81);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_arguments,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)argc != uVar1);
  }
  return;
}

Assistant:

CommandLineParser::CommandLineParser( int argc, 
                                      const char *argv[] )
    : m_useCompiler( false )
    , m_useXml( false )
    , m_briefProgress( false )
    , m_noProgress( false )
    , m_useText( false )
    , m_useCout( false )
    , m_waitBeforeExit( false )
    , m_currentArgument( 0 )
{
  for ( int index =1; index < argc; ++index )
  {
    std::string argument( argv[index ] );
    m_arguments.push_back( argument );
  }
}